

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

int LiteScript::Syntax::ReadContinue
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  bool bVar1;
  uint uVar2;
  Instruction local_70;
  int local_5c;
  undefined4 local_58;
  int i;
  string local_48 [8];
  string keyword;
  ErrorType *errorType_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  char *text_local;
  
  std::__cxx11::string::string(local_48);
  uVar2 = ReadName(text,(string *)local_48);
  if (uVar2 != 0) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"continue");
    if (!bVar1) {
      local_5c = 8;
      uVar2 = ReadWhitespace(text + 8);
      local_5c = local_5c + uVar2;
      Instruction::Instruction(&local_70,INSTR_JUMP_TO,"continue");
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                (instrl,&local_70);
      Instruction::~Instruction(&local_70);
      if (text[local_5c] == ';') {
        text_local._4_4_ = local_5c + 1;
      }
      else {
        *errorType = SCRPT_ERROR_SEMICOLON;
        text_local._4_4_ = local_5c;
      }
      goto LAB_0017352f;
    }
  }
  text_local._4_4_ = 0;
LAB_0017352f:
  local_58 = 1;
  std::__cxx11::string::~string(local_48);
  return text_local._4_4_;
}

Assistant:

int LiteScript::Syntax::ReadContinue(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "continue")
        return 0;
    int i = 8;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, "continue"));
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return i;
    }
    return i + 1;
}